

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O1

msocket_adt_error_t
msocket_bytearray_append(msocket_bytearray_t *self,uint8_t *pData,uint32_t u32DataLen)

{
  msocket_adt_error_t mVar1;
  uint u32MinLen;
  uint8_t *__dest;
  
  if (u32DataLen == 0 || (pData == (uint8_t *)0x0 || self == (msocket_bytearray_t *)0x0)) {
    return '\x01';
  }
  u32MinLen = self->u32CurLen + u32DataLen;
  if ((u32MinLen <= self->u32AllocLen) ||
     (mVar1 = msocket_bytearray_grow(self,u32MinLen), mVar1 == '\0')) {
    mVar1 = '\0';
  }
  if (mVar1 == '\0') {
    __dest = self->pData + self->u32CurLen;
    if (self->pData + self->u32AllocLen < __dest + u32DataLen) {
      __assert_fail("pNext + u32DataLen <= pEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/msocket/src/msocket_adt.c"
                    ,0x54,
                    "msocket_adt_error_t msocket_bytearray_append(msocket_bytearray_t *, const uint8_t *, uint32_t)"
                   );
    }
    memcpy(__dest,pData,(ulong)u32DataLen);
    self->u32CurLen = self->u32CurLen + u32DataLen;
  }
  return mVar1;
}

Assistant:

msocket_adt_error_t msocket_bytearray_append(msocket_bytearray_t *self, const uint8_t *pData, uint32_t u32DataLen){
   if(self && pData && (u32DataLen > 0)){
      msocket_adt_error_t errorCode = msocket_bytearray_reserve(self, self->u32CurLen + u32DataLen);
      if(errorCode == ADT_NO_ERROR){
         uint8_t *pNext, *pEnd;
         pNext = self->pData + self->u32CurLen;
         pEnd = self->pData + self->u32AllocLen;
         assert(pNext + u32DataLen <= pEnd);
         memcpy(pNext,pData,u32DataLen);
         self->u32CurLen+=u32DataLen;
      }
      return errorCode;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}